

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionBinder::QualifyColumnNames
          (ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *lambda_params,bool within_function_expression)

{
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  ColumnRefExpression *pCVar7;
  PositionalReferenceExpression *ref;
  FunctionExpression *this_00;
  type expr_00;
  bool next_within_function_expression;
  string column_name;
  ErrorData error;
  string error_1;
  
  next_within_function_expression = false;
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar5->super_BaseExpression).type;
  if (EVar1 == FUNCTION) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this_00 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar6);
    bVar4 = FunctionExpression::IsLambdaFunction(this_00);
    if (bVar4) {
      QualifyColumnNamesInLambda(this,this_00,lambda_params);
      return;
    }
    next_within_function_expression = true;
  }
  else if (EVar1 == POSITIONAL_REFERENCE) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    ref = BaseExpression::Cast<duckdb::PositionalReferenceExpression>(pBVar6);
    if ((ref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
      error._0_8_ = &error.raw_message._M_string_length;
      error.raw_message._M_dataplus._M_p = (pointer)0x0;
      error.raw_message._M_string_length = error.raw_message._M_string_length & 0xffffffffffffff00;
      column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
      column_name._M_string_length = 0;
      column_name.field_2._M_local_buf[0] = '\0';
      BindContext::BindColumn
                (&error_1,&this->binder->bind_context,ref,(string *)&error,&column_name);
      if (error_1._M_string_length == 0) {
        ::std::__cxx11::string::_M_assign
                  ((string *)&(ref->super_ParsedExpression).super_BaseExpression.alias);
      }
      ::std::__cxx11::string::~string((string *)&error_1);
      ::std::__cxx11::string::~string((string *)&column_name);
      ::std::__cxx11::string::~string((string *)&error);
    }
  }
  else if (EVar1 == COLUMN_REF) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    pCVar7 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
    (*(pCVar7->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])(&error,pCVar7);
    bVar4 = LambdaExpression::IsLambdaParameter(lambda_params,(string *)&error);
    ::std::__cxx11::string::~string((string *)&error);
    if (bVar4) {
      return;
    }
    ErrorData::ErrorData(&error);
    (*this->_vptr_ExpressionBinder[2])(&column_name,this,pCVar7,&error);
    if (column_name._M_dataplus._M_p != (pointer)0x0) {
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expr);
      if ((pPVar5->super_BaseExpression).alias._M_string_length == 0) {
        if (within_function_expression) {
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&column_name);
          (pPVar5->super_BaseExpression).alias._M_string_length = 0;
          *(pPVar5->super_BaseExpression).alias._M_dataplus._M_p = '\0';
        }
      }
      else {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&column_name);
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->(expr);
        ::std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseExpression).alias);
      }
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&column_name);
      _Var3 = column_name._M_dataplus;
      (pPVar5->super_BaseExpression).query_location.index =
           (pCVar7->super_ParsedExpression).super_BaseExpression.query_location.index;
      column_name._M_dataplus._M_p = (pointer)0x0;
      _Var2._M_head_impl =
           (expr->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)_Var3._M_p;
      if ((_Var2._M_head_impl != (ParsedExpression *)0x0) &&
         ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
         column_name._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)column_name._M_dataplus._M_p + 8))();
      }
    }
    ErrorData::~ErrorData(&error);
    return;
  }
  expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*(expr);
  error.raw_message._M_string_length = 0;
  error.raw_message.field_2._M_allocated_capacity = 0;
  error.initialized = false;
  error.type = INVALID;
  error._2_6_ = 0;
  error.raw_message._M_dataplus._M_p = (pointer)0x0;
  error._0_8_ = operator_new(0x18);
  *(vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
    **)error._0_8_ = lambda_params;
  *(bool **)(error._0_8_ + 8) = &next_within_function_expression;
  *(ExpressionBinder **)(error._0_8_ + 0x10) = this;
  error.raw_message.field_2._M_allocated_capacity =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_columnref_expression.cpp:170:53)>
       ::_M_invoke;
  error.raw_message._M_string_length =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_columnref_expression.cpp:170:53)>
       ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (expr_00,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                      *)&error);
  ::std::_Function_base::~_Function_base((_Function_base *)&error);
  return;
}

Assistant:

void ExpressionBinder::QualifyColumnNames(unique_ptr<ParsedExpression> &expr,
                                          vector<unordered_set<string>> &lambda_params,
                                          const bool within_function_expression) {

	bool next_within_function_expression = false;
	switch (expr->GetExpressionType()) {
	case ExpressionType::COLUMN_REF: {
		auto &col_ref = expr->Cast<ColumnRefExpression>();

		// don't qualify lambda parameters
		if (LambdaExpression::IsLambdaParameter(lambda_params, col_ref.GetName())) {
			return;
		}

		ErrorData error;
		auto new_expr = QualifyColumnName(col_ref, error);

		if (new_expr) {
			if (!expr->GetAlias().empty()) {
				// Pre-existing aliases are added to the qualified column reference
				new_expr->SetAlias(expr->GetAlias());
			} else if (within_function_expression) {
				// Qualifying the column reference may add an alias, but this needs to be removed within function
				// expressions, because the alias here means a named parameter instead of a positional parameter
				new_expr->ClearAlias();
			}

			// replace the expression with the qualified column reference
			new_expr->SetQueryLocation(col_ref.GetQueryLocation());
			expr = std::move(new_expr);
		}
		return;
	}
	case ExpressionType::POSITIONAL_REFERENCE: {
		auto &ref = expr->Cast<PositionalReferenceExpression>();
		if (ref.GetAlias().empty()) {
			string table_name, column_name;
			auto error = binder.bind_context.BindColumn(ref, table_name, column_name);
			if (error.empty()) {
				ref.SetAlias(column_name);
			}
		}
		break;
	}
	case ExpressionType::FUNCTION: {
		// Special-handling for lambdas, which are inside function expressions.
		auto &function = expr->Cast<FunctionExpression>();
		if (function.IsLambdaFunction()) {
			return QualifyColumnNamesInLambda(function, lambda_params);
		}

		next_within_function_expression = true;
		break;
	}
	default: // fall through
		break;
	}

	// recurse on the child expressions
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child) {
		QualifyColumnNames(child, lambda_params, next_within_function_expression);
	});
}